

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O0

AArch64_AM_ShiftExtendType AArch64_AM_getExtendType(uint Imm)

{
  uint Imm_local;
  AArch64_AM_ShiftExtendType local_4;
  
  switch(Imm) {
  default:
    local_4 = AArch64_AM_UXTB;
    break;
  case 1:
    local_4 = AArch64_AM_UXTH;
    break;
  case 2:
    local_4 = AArch64_AM_UXTW;
    break;
  case 3:
    local_4 = AArch64_AM_UXTX;
    break;
  case 4:
    local_4 = AArch64_AM_SXTB;
    break;
  case 5:
    local_4 = AArch64_AM_SXTH;
    break;
  case 6:
    local_4 = AArch64_AM_SXTW;
    break;
  case 7:
    local_4 = AArch64_AM_SXTX;
  }
  return local_4;
}

Assistant:

static inline AArch64_AM_ShiftExtendType AArch64_AM_getExtendType(unsigned Imm)
{
	// assert((Imm & 0x7) == Imm && "invalid immediate!");
	switch (Imm) {
		default: // llvm_unreachable("Compiler bug!");
		case 0: return AArch64_AM_UXTB;
		case 1: return AArch64_AM_UXTH;
		case 2: return AArch64_AM_UXTW;
		case 3: return AArch64_AM_UXTX;
		case 4: return AArch64_AM_SXTB;
		case 5: return AArch64_AM_SXTH;
		case 6: return AArch64_AM_SXTW;
		case 7: return AArch64_AM_SXTX;
	}
}